

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv_c.cpp
# Opt level: O1

void dxil_spv_converter_add_local_root_descriptor
               (dxil_spv_converter converter,dxil_spv_resource_class resource_class,
               uint register_space,uint register_index)

{
  LocalRootParameter local_48;
  
  local_48.local_constants.register_index = 0;
  local_48.local_constants.num_words = 0;
  local_48.table_entries.
  super__Vector_base<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.table_entries.
  super__Vector_base<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.table_entries.
  super__Vector_base<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.type = Descriptor;
  local_48.local_constants.register_space = 0;
  local_48.local_descriptor.register_index = register_index;
  local_48.local_descriptor.register_space = register_space;
  local_48.local_descriptor.resource_class = resource_class;
  std::vector<LocalRootParameter,_dxil_spv::ThreadLocalAllocator<LocalRootParameter>_>::
  emplace_back<LocalRootParameter>(&converter->local_root_parameters,&local_48);
  if (local_48.table_entries.
      super__Vector_base<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    dxil_spv::free_in_thread
              (local_48.table_entries.
               super__Vector_base<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void dxil_spv_converter_add_local_root_descriptor(dxil_spv_converter converter,
                                                  dxil_spv_resource_class resource_class,
                                                  unsigned register_space,
                                                  unsigned register_index)
{
	LocalRootParameter param = {};
	param.type = LocalRootParameterType::Descriptor;
	param.local_descriptor = { ResourceClass(resource_class), register_space, register_index };
	converter->local_root_parameters.push_back(std::move(param));
}